

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-utils.h
# Opt level: O0

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::ModuleUtils::
ParallelFunctionAnalysis<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
::ParallelFunctionAnalysis::Mapper::create(Mapper *this)

{
  long in_RSI;
  Mapper *this_local;
  
  this_local = (Mapper *)this;
  std::
  make_unique<wasm::ModuleUtils::ParallelFunctionAnalysis<std::vector<wasm::Name,std::allocator<wasm::Name>>,(wasm::Mutability)0,wasm::ModuleUtils::DefaultMap>::ParallelFunctionAnalysis(wasm::Module&,std::function<void(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)>)::Mapper,wasm::Module&,std::map<wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>,std::less<wasm::Function*>,std::allocator<std::pair<wasm::Function*const,std::vector<wasm::Name,std::allocator<wasm::Name>>>>>&,std::function<void(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)>&>
            ((Module *)&stack0xffffffffffffffe0,
             *(map<wasm::Function_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>_>
               **)(in_RSI + 0x108),
             *(function<void_(wasm::Function_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_&)>
               **)(in_RSI + 0x110));
  std::unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>>::
  unique_ptr<wasm::ModuleUtils::ParallelFunctionAnalysis<std::vector<wasm::Name,std::allocator<wasm::Name>>,(wasm::Mutability)0,wasm::ModuleUtils::DefaultMap>::ParallelFunctionAnalysis(wasm::Module&,std::function<void(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)>)::Mapper,std::default_delete<wasm::ModuleUtils::ParallelFunctionAnalysis<std::vector<wasm::Name,std::allocator<wasm::Name>>,(wasm::Mutability)0,wasm::ModuleUtils::DefaultMap>::ParallelFunctionAnalysis(wasm::Module&,std::function<void(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)>)::Mapper>,void>
            ((unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>> *)this,
             (unique_ptr<Mapper,_std::default_delete<Mapper>_> *)&stack0xffffffffffffffe0);
  std::unique_ptr<Mapper,_std::default_delete<Mapper>_>::~unique_ptr
            ((unique_ptr<Mapper,_std::default_delete<Mapper>_> *)&stack0xffffffffffffffe0);
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
        return std::make_unique<Mapper>(module, map, work);
      }